

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall duckdb_parquet::XxHash::write(XxHash *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"XxHash");
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t XxHash::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("XxHash");

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}